

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlayout.cpp
# Opt level: O1

bool __thiscall QLayout::setAlignment(QLayout *this,QWidget *w,Alignment alignment)

{
  int iVar1;
  int iVar2;
  QLayoutItem *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  bool bVar3;
  
  this_00 = (QLayoutItem *)(**(code **)(*(long *)this + 0xa8))(this,0);
  bVar3 = this_00 != (QLayoutItem *)0x0;
  if (bVar3) {
    iVar1 = (*this_00->_vptr_QLayoutItem[0xd])(this_00);
    if ((QWidget *)CONCAT44(extraout_var,iVar1) != w) {
      iVar1 = 1;
      do {
        this_00 = (QLayoutItem *)(**(code **)(*(long *)this + 0xa8))(this,iVar1);
        bVar3 = this_00 != (QLayoutItem *)0x0;
        if (this_00 == (QLayoutItem *)0x0) {
          return bVar3;
        }
        iVar2 = (*this_00->_vptr_QLayoutItem[0xd])(this_00);
        iVar1 = iVar1 + 1;
      } while ((QWidget *)CONCAT44(extraout_var_00,iVar2) != w);
    }
    QLayoutItem::setAlignment(this_00,alignment);
    (**(code **)(*(long *)this + 0x70))(this);
  }
  return bVar3;
}

Assistant:

bool QLayout::setAlignment(QWidget *w, Qt::Alignment alignment)
{
    int i = 0;
    QLayoutItem *item = itemAt(i);
    while (item) {
        if (item->widget() == w) {
            item->setAlignment(alignment);
            invalidate();
            return true;
        }
        ++i;
        item = itemAt(i);
    }
    return false;
}